

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-token.c
# Opt level: O2

int fy_token_iter_utf8_get(fy_token_iter *iter)

{
  size_t *psVar1;
  uint8_t *ptr;
  ulong uVar2;
  uint left;
  int iVar3;
  ulong uVar4;
  int w1;
  
  iVar3 = iter->unget_c;
  if (iVar3 == -1) {
    ptr = (uint8_t *)(iter->ic).str;
    if (ptr == (uint8_t *)0x0) {
      iVar3 = fy_atom_iter_utf8_get(&iter->atom_iter);
      return iVar3;
    }
    uVar2 = (iter->ic).len;
    iVar3 = -1;
    if (uVar2 != 0) {
      left = fy_utf8_width_by_first_octet(*ptr);
      if ((left != 0) && (uVar4 = (ulong)left, uVar4 <= uVar2)) {
        iVar3 = fy_utf8_get(ptr,left,&w1);
        (iter->ic).str = (iter->ic).str + uVar4;
        psVar1 = &(iter->ic).len;
        *psVar1 = *psVar1 - uVar4;
      }
    }
  }
  else {
    iter->unget_c = -1;
  }
  return iVar3;
}

Assistant:

int fy_token_iter_utf8_get(struct fy_token_iter *iter) {
    int c, w, w1;

    /* first try the pushed ungetc */
    if (iter->unget_c != -1) {
        c = iter->unget_c;
        iter->unget_c = -1;
        return c;
    }

    /* direct */
    if (iter->ic.str) {

        /* not even 1 octet */
        if (!iter->ic.len)
            return -1;

        /* get width by the first octet */
        w = fy_utf8_width_by_first_octet((uint8_t) *iter->ic.str);
        if (!w || (unsigned int) w > iter->ic.len)
            return -1;

        /* get the next character */
        c = fy_utf8_get(iter->ic.str, w, &w1);

        iter->ic.str += w;
        iter->ic.len -= w;

        return c;
    }

    return fy_atom_iter_utf8_get(&iter->atom_iter);
}